

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

bool __thiscall Js::FunctionBody::HasNonBuiltInCallee(FunctionBody *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ProfileId callSiteId;
  bool bVar4;
  
  bVar4 = this->profiledCallSiteCount != 0;
  if (bVar4) {
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    callSiteId = 0;
    do {
      if ((this->dynamicProfileInfo).ptr == (DynamicProfileInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar3 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                    ,0x1e9d,"(HasDynamicProfileInfo())","HasDynamicProfileInfo()");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar3 = 0;
      }
      bVar2 = DynamicProfileInfo::MayHaveNonBuiltinCallee((this->dynamicProfileInfo).ptr,callSiteId)
      ;
      if (bVar2) {
        return bVar4;
      }
      callSiteId = callSiteId + 1;
      bVar4 = callSiteId < this->profiledCallSiteCount;
    } while (bVar4);
  }
  return bVar4;
}

Assistant:

bool FunctionBody::HasNonBuiltInCallee()
    {
        for (ProfileId i = 0; i < profiledCallSiteCount; i++)
        {
            Assert(HasDynamicProfileInfo());
            if (dynamicProfileInfo->MayHaveNonBuiltinCallee(i))
            {
                return true;
            }
        }
        return false;
    }